

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::PosixMmapReadableFile
          (PosixMmapReadableFile *this,string *filename,char *mmap_base,size_t length,
          Limiter *mmap_limiter)

{
  Limiter *mmap_limiter_local;
  size_t length_local;
  char *mmap_base_local;
  string *filename_local;
  PosixMmapReadableFile *this_local;
  
  RandomAccessFile::RandomAccessFile(&this->super_RandomAccessFile);
  (this->super_RandomAccessFile)._vptr_RandomAccessFile =
       (_func_int **)&PTR__PosixMmapReadableFile_00122970;
  this->mmap_base_ = mmap_base;
  this->length_ = length;
  this->mmap_limiter_ = mmap_limiter;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  return;
}

Assistant:

PosixMmapReadableFile(std::string filename, char* mmap_base, size_t length,
                        Limiter* mmap_limiter)
      : mmap_base_(mmap_base),
        length_(length),
        mmap_limiter_(mmap_limiter),
        filename_(std::move(filename)) {}